

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O0

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::transcode_slice
          (basisu_lowlevel_etc1s_transcoder *this,void *pDst_blocks,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint8_t *pImage_data,uint32_t image_data_size,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,bool bc1_allow_threecolor_blocks,
          basis_file_header *header,basis_slice_desc *slice_desc,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          bool astc_transcode_alpha,void *pAlpha_blocks,uint32_t output_rows_in_pixels)

{
  bool bVar1;
  long in_stack_00000020;
  long in_stack_00000028;
  undefined1 in_stack_000005d8;
  undefined1 in_stack_000005d9;
  undefined1 in_stack_000005da;
  undefined1 in_stack_000005db;
  uint32_t in_stack_000005dc;
  uint8_t *in_stack_000005e0;
  uint32_t in_stack_000005e8;
  uint32_t in_stack_000005ec;
  void *in_stack_000005f0;
  basisu_lowlevel_etc1s_transcoder *in_stack_000005f8;
  block_format in_stack_00000620;
  uint32_t in_stack_00000628;
  uint32_t in_stack_00000648;
  uint32_t in_stack_00000650;
  uint32_t in_stack_00000658;
  uint32_t in_stack_00000660;
  basisu_transcoder_state *in_stack_00000668;
  void *in_stack_00000678;
  uint32_t in_stack_00000680;
  
  basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_stack_00000020 + 0x17));
  basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_stack_00000028 + 4));
  basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_stack_00000028 + 3));
  basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_stack_00000028 + 5));
  basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_stack_00000028 + 7));
  bVar1 = transcode_slice(in_stack_000005f8,in_stack_000005f0,in_stack_000005ec,in_stack_000005e8,
                          in_stack_000005e0,in_stack_000005dc,in_stack_00000620,in_stack_00000628,
                          (bool)in_stack_000005db,(bool)in_stack_000005da,(bool)in_stack_000005d9,
                          in_stack_00000648,in_stack_00000650,in_stack_00000658,in_stack_00000660,
                          in_stack_00000668,(bool)in_stack_000005d8,in_stack_00000678,
                          in_stack_00000680);
  return bVar1;
}

Assistant:

bool transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
			uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, const basis_file_header& header, const basis_slice_desc& slice_desc, uint32_t output_row_pitch_in_blocks_or_pixels = 0,
			basisu_transcoder_state* pState = nullptr, bool astc_transcode_alpha = false, void* pAlpha_blocks = nullptr, uint32_t output_rows_in_pixels = 0)
		{
			return transcode_slice(pDst_blocks, num_blocks_x, num_blocks_y, pImage_data, image_data_size, fmt, output_block_or_pixel_stride_in_bytes, bc1_allow_threecolor_blocks,
				header.m_tex_type == cBASISTexTypeVideoFrames, (slice_desc.m_flags & cSliceDescFlagsHasAlpha) != 0, slice_desc.m_level_index,
				slice_desc.m_orig_width, slice_desc.m_orig_height, output_row_pitch_in_blocks_or_pixels, pState,
				astc_transcode_alpha,
				pAlpha_blocks,
				output_rows_in_pixels);
		}